

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserInterface.cpp
# Opt level: O0

bool __thiscall TextField::update(TextField *this,int mouseX,int mouseY,bool clicked)

{
  float fVar1;
  bool bVar2;
  Vector2f *pVVar3;
  ulong uVar4;
  size_t sVar5;
  byte in_CL;
  int in_ESI;
  long in_RDI;
  float fVar6;
  Vector2f VVar7;
  double dVar8;
  FloatRect FVar9;
  float distance;
  uint i;
  float closestDistance;
  uint closestIndex;
  Shape *in_stack_ffffffffffffffa0;
  float in_stack_ffffffffffffffb8;
  float in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  uint uVar10;
  uint uVar11;
  float fVar12;
  
  if ((((*(byte *)(in_RDI + 0xb1) & 1) != 0) && ((*(byte *)(in_RDI + 0x651) & 1) != 0)) &&
     ((in_CL & 1) != 0)) {
    pVVar3 = sf::Transformable::getPosition((Transformable *)(in_RDI + 8));
    fVar1 = pVVar3->x;
    sf::Transformable::getPosition((Transformable *)(in_RDI + 8));
    FVar9 = sf::Shape::getGlobalBounds(in_stack_ffffffffffffffa0);
    fVar12 = FVar9.left;
    bVar2 = sf::Rect<float>::contains
                      ((Rect<float> *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
    if (bVar2) {
      uVar11 = 0;
      fVar6 = std::numeric_limits<float>::max();
      uVar10 = 0;
      while( true ) {
        uVar4 = (ulong)uVar10;
        sf::Text::getString((Text *)(in_RDI + 0x228));
        sVar5 = sf::String::getSize((String *)0x1a9450);
        if (sVar5 < uVar4) break;
        VVar7 = sf::Text::findCharacterPos((Text *)CONCAT44(fVar12,uVar11),CONCAT44(fVar6,uVar10));
        dVar8 = std::fabs((double)(ulong)(uint)((float)(in_ESI - (int)fVar1) - VVar7.x));
        if (SUB84(dVar8,0) < fVar6) {
          fVar6 = SUB84(dVar8,0);
          uVar11 = uVar10;
        }
        uVar10 = uVar10 + 1;
      }
      *(uint *)(in_RDI + 0x648) = uVar11;
      VVar7 = sf::Text::findCharacterPos((Text *)CONCAT44(fVar12,uVar11),CONCAT44(fVar6,uVar10));
      sf::Transformable::setPosition((Transformable *)(in_RDI + 0x4f8),VVar7.x,2.0);
      *(undefined1 *)(in_RDI + 0x650) = 1;
    }
    else if ((*(byte *)(in_RDI + 0x650) & 1) != 0) {
      *(undefined1 *)(in_RDI + 0x650) = 0;
    }
  }
  return false;
}

Assistant:

bool TextField::update(int mouseX, int mouseY, bool clicked) {
    if (visible && isEditable && clicked) {
        mouseX -= static_cast<int>(getPosition().x);
        mouseY -= static_cast<int>(getPosition().y);
        if (background.getGlobalBounds().contains(static_cast<float>(mouseX), static_cast<float>(mouseY))) {
            unsigned int closestIndex = 0;
            float closestDistance = numeric_limits<float>::max();
            for (unsigned int i = 0; i <= field.getString().getSize(); ++i) {
                float distance = fabs(mouseX - field.findCharacterPos(i).x);
                if (distance < closestDistance) {
                    closestIndex = i;
                    closestDistance = distance;
                }
            }
            caretPosition = closestIndex;
            caret.setPosition(field.findCharacterPos(caretPosition).x, 2.0f);
            selected = true;
        } else if (selected) {
            selected = false;
        }
    }
    return false;
}